

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_object_base(parser *p)

{
  undefined8 *puVar1;
  void *p_00;
  undefined8 *__src;
  
  p_00 = parser_priv(p);
  if (p_00 != (void *)0x0) {
    kb_info = (object_base *)mem_zalloc(0x1560);
    __src = *(undefined8 **)((long)p_00 + 0x98);
    while (__src != (undefined8 *)0x0) {
      if ((ulong)*(uint *)(__src + 1) < 0x24) {
        memcpy(kb_info + *(uint *)(__src + 1),__src,0x98);
      }
      else {
        string_free((char *)*__src);
      }
      puVar1 = (undefined8 *)__src[2];
      mem_free(__src);
      __src = puVar1;
    }
    mem_free(p_00);
    parser_destroy(p);
    return 0;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0x275,"errr finish_parse_object_base(struct parser *)");
}

Assistant:

static errr finish_parse_object_base(struct parser *p) {
	struct object_base *kb;
	struct object_base *next = NULL;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);

	kb_info = mem_zalloc(TV_MAX * sizeof(*kb_info));

	for (kb = d->kb; kb; kb = next) {
		if (kb->tval < TV_MAX && kb->tval >= 0) {
			memcpy(&kb_info[kb->tval], kb, sizeof(*kb));
		} else {
			string_free(kb->name);
		}
		next = kb->next;
		mem_free(kb);
	}

	mem_free(d);
	parser_destroy(p);
	return 0;
}